

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outofrange.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined4 extraout_var;
  int local_a4;
  int i;
  invalid_key_exception inv_ex;
  bad_shm_alloc ex;
  int32_t *ptr;
  shm_key_t key;
  char **argv_local;
  int argc_local;
  
  shm::gen_key((shm_key_t *)&ptr,0x2a);
  std::numeric_limits<unsigned_long>::max();
  iVar1 = shm::init((EVP_PKEY_CTX *)&ptr);
  for (local_a4 = 0; local_a4 < 100; local_a4 = local_a4 + 1) {
    *(int *)(CONCAT44(extraout_var,iVar1) + (long)local_a4 * 4) = local_a4;
  }
  shm::close((int)&ptr);
  return 0;
}

Assistant:

int
main( int argc, char **argv )
{
   //os x has a limited range on file names, 32 char including null
   shm_key_t key;
   shm::gen_key( key, 42 );
   std::int32_t *ptr( nullptr );
   try
   {
      //try to allocate too much memory
      ptr = reinterpret_cast< std::int32_t* >( 
        shm::init( key, std::numeric_limits<std::uint64_t>::max() ) 
      );
   }

   catch( bad_shm_alloc ex )
   {
      std::fprintf( stderr, "we're in the right area, failure\n" );
      ptr = nullptr;
      /** this is where we wanted to end up **/
      try
      { 
      shm::close( key, 
                  reinterpret_cast<void**>( &ptr), 
                  0x1000,
                  false,
                  true );
      }
      catch( invalid_key_exception inv_ex )
      {
         std::cerr << "trying to unlink is okay...some systems need this\n";
         std::cerr << inv_ex.what() << "\n";
      }
      std::cerr << ex.what() << "\n";
      exit( EXIT_SUCCESS );
   }
   for( int i( 0 ); i < 100; i++ )
   {  
      ptr[ i ] = i;
   }
   /** if we get to this point then we assume that the mem is writable **/
   shm::close( key, 
               reinterpret_cast<void**>(&ptr), 
               0x1000,
               true,
               true );
   /** should get here and be done **/
   return( EXIT_SUCCESS );
}